

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_target(t_parser *this,bool a_assignable)

{
  size_t sVar1;
  t_script *ptVar2;
  __single_object _Var3;
  bool bVar4;
  t_token tVar5;
  t_at *ptVar6;
  t_variable *__args_3;
  t_self *this_00;
  const_iterator pvVar7;
  pointer ptVar8;
  pointer ptVar9;
  pointer ppVar10;
  size_type sVar11;
  __uniq_ptr_data<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>,_true,_true>
  _Var12;
  set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
  *psVar13;
  reference pptVar14;
  reference pptVar15;
  size_type sVar16;
  t_global *ptVar17;
  t_type *ptVar18;
  t_object *ptVar19;
  pointer ptVar20;
  __uniq_ptr_data<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>,_true,_true> _Var21;
  byte in_DL;
  undefined7 in_register_00000031;
  t_parser *this_01;
  t_lexer *this_02;
  pair<std::_Rb_tree_const_iterator<xemmai::t_object_*>,_bool> pVar22;
  wstring_view wVar23;
  pair<std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_bool>
  pVar24;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar25;
  t_object *local_778;
  t_scope *local_708;
  t_class *local_5b8;
  set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
  *local_590;
  undefined1 local_538 [16];
  __uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> _Stack_528;
  t_at at_5;
  undefined1 local_508 [16];
  __uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> local_4f8;
  t_at at_4;
  undefined1 local_4d0 [24];
  undefined1 local_4b8 [8];
  t_at at_3;
  undefined1 local_498 [24];
  undefined1 local_480 [8];
  t_at at_2;
  undefined1 local_460 [16];
  t_object *value_2;
  double local_448;
  double value_1;
  size_t local_438;
  intptr_t value;
  undefined1 local_428 [24];
  undefined1 local_410 [16];
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_400;
  undefined1 local_3f0 [24];
  __single_object call_2;
  size_t indent_3;
  undefined1 local_3c0 [16];
  __single_object call_1;
  size_t indent_2;
  t_variable *p_1;
  t_object *local_398;
  t_variable *p;
  __normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
  j;
  iterator i_1;
  vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_> variables;
  _Self local_358;
  _Self local_350;
  iterator i_3;
  t_object *symbol_3;
  iterator __end3_1;
  iterator __begin3_1;
  set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
  *__range3_1;
  _Self local_318;
  _Self local_310;
  iterator i_2;
  t_object *symbol_2;
  iterator __end3;
  iterator __begin3;
  set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
  *__range3;
  undefined1 local_2d8 [22];
  bool can_return;
  bool can_jump;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_2b8;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  t_variable local_298;
  t_object *local_280;
  _Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_> local_278;
  bool local_270;
  t_object *local_268;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_260;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_250;
  undefined1 local_240 [72];
  __single_object lambda;
  size_t indent_1;
  undefined1 local_1b8 [16];
  __single_object call;
  size_t indent;
  anon_union_8_3_60b33e96_for_t_lexer_12 local_198;
  t_object *symbol_1;
  undefined1 local_180 [24];
  undefined1 local_168 [24];
  __uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> local_150;
  t_object *key;
  t_at at_1;
  value_type_conflict c;
  const_iterator __end4;
  const_iterator __begin4;
  wchar_t *local_f0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *local_e8;
  wstring_view *__range4;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> target;
  t_at local_c8;
  undefined1 local_a0 [16];
  t_variable *local_90;
  t_variable *variable;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_78;
  t_object *local_68;
  t_object *symbol;
  t_scope *local_50;
  size_t i;
  t_scope *scope;
  size_t outer;
  t_at at;
  bool a_assignable_local;
  t_parser *this_local;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *expression;
  
  this_01 = (t_parser *)CONCAT71(in_register_00000031,a_assignable);
  at.v_column._7_1_ = in_DL & 1;
  ptVar6 = t_lexer::f_at(&this_01->v_lexer);
  at.v_line = ptVar6->v_column;
  outer = ptVar6->v_position;
  at.v_position = ptVar6->v_line;
  tVar5 = t_lexer::f_token(&this_01->v_lexer);
  switch(tVar5) {
  case c_token__APOSTROPHE:
    t_lexer::f_next(&this_01->v_lexer);
    tVar5 = t_lexer::f_token(&this_01->v_lexer);
    if (tVar5 == c_token__LEFT_PARENTHESIS) {
      call._M_t.
      super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>._M_t.
      super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>.
      super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
           (__uniq_ptr_data<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>,_true,_true>
            )t_lexer::f_indent(&this_01->v_lexer);
      t_lexer::f_next(&this_01->v_lexer);
      ptVar2 = this_01->v_module;
      ptVar17 = f_global();
      ptVar18 = t_global::f_type<xemmai::t_tuple>(ptVar17);
      ptVar19 = t_object::f_of(ptVar18);
      t_script::f_slot(ptVar2,ptVar19);
      std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*>
                ((t_at *)local_1b8,(t_object **)&outer);
      std::
      make_unique<xemmai::ast::t_call,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_literal<xemmai::t_object*>,std::default_delete<xemmai::ast::t_literal<xemmai::t_object*>>>>
                ((t_at *)(local_1b8 + 8),
                 (unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                  *)&outer);
      std::
      unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
      ::~unique_ptr((unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                     *)local_1b8);
      bVar4 = t_lexer::f_newline(&this_01->v_lexer);
      if (((!bVar4) ||
          (_Var21.
           super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>.
           super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
                (__uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>)
                t_lexer::f_indent(&this_01->v_lexer),
          (ulong)call._M_t.
                 super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                 .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl <
          (ulong)_Var21.
                 super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                 .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl)) &&
         (tVar5 = t_lexer::f_token(&this_01->v_lexer), _Var3 = call,
         tVar5 != c_token__RIGHT_PARENTHESIS)) {
        ptVar20 = std::unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>::
                  operator->((unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                              *)(local_1b8 + 8));
        bVar4 = f_expressions(this_01,(size_t)_Var3._M_t.
                                              super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                                              .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>.
                                              _M_head_impl,&ptVar20->v_arguments);
        ptVar20 = std::unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>::
                  operator->((unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                              *)(local_1b8 + 8));
        ptVar20->v_expand = bVar4;
      }
      bVar4 = t_lexer::f_newline(&this_01->v_lexer);
      if (((!bVar4) ||
          (_Var21.
           super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>.
           super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
                (__uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>)
                t_lexer::f_indent(&this_01->v_lexer),
          (ulong)call._M_t.
                 super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                 .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl <=
          (ulong)_Var21.
                 super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                 .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl)) &&
         (tVar5 = t_lexer::f_token(&this_01->v_lexer), tVar5 == c_token__RIGHT_PARENTHESIS)) {
        t_lexer::f_next(&this_01->v_lexer);
      }
      std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
      unique_ptr<xemmai::ast::t_call,std::default_delete<xemmai::ast::t_call>,void>
                ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
                 (unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_> *)
                 (local_1b8 + 8));
      local_180._12_4_ = 1;
      std::unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>::~unique_ptr
                ((unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_> *)
                 (local_1b8 + 8));
    }
    else {
      if (tVar5 != c_token__SYMBOL) {
        bVar25 = sv(L"expecting symbol or \'(\'.",0x18);
        f_throw(this_01,bVar25);
      }
      local_198.v_string = f_symbol(this_01);
      t_lexer::f_next(&this_01->v_lexer);
      std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*&>
                ((t_at *)&indent,(t_object **)&outer);
      std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
      unique_ptr<xemmai::ast::t_literal<xemmai::t_object*>,std::default_delete<xemmai::ast::t_literal<xemmai::t_object*>>,void>
                ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
                 (unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                  *)&indent);
      std::
      unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
      ::~unique_ptr((unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                     *)&indent);
    }
    break;
  case c_token__LEFT_PARENTHESIS:
    t_lexer::f_next(&this_01->v_lexer);
    f_expression(this);
    tVar5 = t_lexer::f_token(&this_01->v_lexer);
    if (tVar5 != c_token__RIGHT_PARENTHESIS) {
      bVar25 = sv(L"expecting \')\'.",0xe);
      f_throw(this_01,bVar25);
    }
    t_lexer::f_next(&this_01->v_lexer);
    break;
  default:
    bVar25 = sv(L"unexpected token.",0x11);
    f_throw(this_01,bVar25);
  case c_token__COLON:
  case c_token__SYMBOL:
  case c_token__SELF:
    scope = (t_scope *)0x0;
    i = (size_t)this_01->v_scope;
    tVar5 = t_lexer::f_token(&this_01->v_lexer);
    if (tVar5 == c_token__COLON) {
      scope = (t_scope *)t_lexer::f_integer(&this_01->v_lexer);
      for (local_50 = (t_scope *)0x0; local_50 < scope;
          local_50 = (t_scope *)((long)&local_50->v_outer + 1)) {
        if (i == 0) {
          _symbol = sv(L"no more outer scope.",0x14);
          f_throw(this_01,_symbol);
        }
        i = *(size_t *)i;
      }
      t_lexer::f_next(&this_01->v_lexer);
    }
    tVar5 = t_lexer::f_token(&this_01->v_lexer);
    if (tVar5 == c_token__SYMBOL) {
      local_68 = f_symbol(this_01);
      t_lexer::f_next(&this_01->v_lexer);
      tVar5 = t_lexer::f_token(&this_01->v_lexer);
      if (tVar5 == c_token__EQUAL) {
        if ((at.v_column._7_1_ & 1) == 0) {
          local_78 = sv(L"can not assign to expression.",0x1d);
          f_throw(this_01,local_78);
        }
        if (i == 0) {
          _variable = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                       )sv(L"no more outer scope.",0x14);
          f_throw(this_01,(wstring_view)_variable);
        }
        t_lexer::f_next(&this_01->v_lexer);
        __args_3 = f_variable(this_01,(t_scope *)i,local_68);
        if (scope != (t_scope *)0x0) {
          __args_3->v_varies = true;
          __args_3->v_shared = true;
        }
        local_90 = __args_3;
        f_expression((t_parser *)local_a0);
        std::
        make_unique<xemmai::ast::t_scope_put,xemmai::t_at&,unsigned_long&,xemmai::t_code::t_variable&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                  ((t_at *)(local_a0 + 8),&outer,(t_variable *)&scope,
                   (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                   __args_3);
        std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
        unique_ptr<xemmai::ast::t_scope_put,std::default_delete<xemmai::ast::t_scope_put>,void>
                  ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
                   (unique_ptr<xemmai::ast::t_scope_put,_std::default_delete<xemmai::ast::t_scope_put>_>
                    *)(local_a0 + 8));
        std::unique_ptr<xemmai::ast::t_scope_put,_std::default_delete<xemmai::ast::t_scope_put>_>::
        ~unique_ptr((unique_ptr<xemmai::ast::t_scope_put,_std::default_delete<xemmai::ast::t_scope_put>_>
                     *)(local_a0 + 8));
        std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
                  ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                   local_a0);
      }
      else {
        if (i != 0) {
          if (scope == (t_scope *)0x0) {
            local_590 = (set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
                         *)(i + 0x28);
          }
          else {
            local_590 = (set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
                         *)(i + 0x58);
          }
          pVar22 = std::
                   set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
                   ::insert(local_590,&local_68);
          local_c8.v_line = (size_t)pVar22.first._M_node;
          local_c8.v_column._0_1_ = pVar22.second;
        }
        std::
        make_unique<xemmai::ast::t_symbol_get,xemmai::t_at&,unsigned_long&,xemmai::ast::t_scope*&,xemmai::t_object*&>
                  (&local_c8,&outer,&scope,(t_object **)&i);
        std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
        unique_ptr<xemmai::ast::t_symbol_get,std::default_delete<xemmai::ast::t_symbol_get>,void>
                  ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
                   (unique_ptr<xemmai::ast::t_symbol_get,_std::default_delete<xemmai::ast::t_symbol_get>_>
                    *)&local_c8);
        std::unique_ptr<xemmai::ast::t_symbol_get,_std::default_delete<xemmai::ast::t_symbol_get>_>
        ::~unique_ptr((unique_ptr<xemmai::ast::t_symbol_get,_std::default_delete<xemmai::ast::t_symbol_get>_>
                       *)&local_c8);
      }
    }
    else {
      if (tVar5 != c_token__SELF) {
        _symbol_1 = sv(L"expecting symbol or self.",0x19);
        f_throw(this_01,_symbol_1);
      }
      if (i == 0) {
        _target = sv(L"no more outer scope.",0x14);
        f_throw(this_01,_target);
      }
      if (scope != (t_scope *)0x0) {
        *(undefined1 *)(i + 0x21) = 1;
      }
      this_00 = (t_self *)operator_new(0x28);
      ast::t_self::t_self(this_00,(t_at *)&outer,(size_t)scope);
      std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
      unique_ptr<std::default_delete<xemmai::ast::t_node>,void>
                ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)
                 &__range4,(pointer)this_00);
      wVar23 = t_lexer::f_value(&this_01->v_lexer);
      local_f0 = wVar23._M_str;
      __begin4 = (const_iterator)wVar23._M_len;
      local_e8 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&__begin4;
      __end4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin(local_e8);
      pvVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end(local_e8);
      for (; __end4 != pvVar7; __end4 = __end4 + 1) {
        at_1.v_column._7_1_ = 0;
        if (*__end4 == 0x40) {
          local_5b8 = (t_class *)operator_new(0x28);
          ast::t_class::t_class
                    (local_5b8,(t_at *)&outer,
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     &__range4);
        }
        else {
          local_5b8 = (t_class *)operator_new(0x28);
          at_1.v_column._7_1_ = 1;
          ast::t_super::t_super
                    ((t_super *)local_5b8,(t_at *)&outer,
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     &__range4);
        }
        std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::reset
                  ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                   &__range4,&local_5b8->super_t_node);
      }
      t_lexer::f_next(&this_01->v_lexer);
      bVar4 = t_lexer::f_newline(&this_01->v_lexer);
      if ((bVar4) || (tVar5 = t_lexer::f_token(&this_01->v_lexer), tVar5 != c_token__SYMBOL)) {
        std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::unique_ptr
                  ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                   this,(unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
                         *)&__range4);
      }
      else {
        ptVar6 = t_lexer::f_at(&this_01->v_lexer);
        at_1.v_line = ptVar6->v_column;
        key = (t_object *)ptVar6->v_position;
        at_1.v_position = ptVar6->v_line;
        local_150._M_t.
        super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
        super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl =
             (tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)
             f_symbol(this_01);
        t_lexer::f_next(&this_01->v_lexer);
        tVar5 = t_lexer::f_token(&this_01->v_lexer);
        if (tVar5 == c_token__EQUAL) {
          if ((at.v_column._7_1_ & 1) == 0) {
            local_168._8_16_ = (undefined1  [16])sv(L"can not assign to expression.",0x1d);
            f_throw(this_01,(wstring_view)local_168._8_16_);
          }
          t_lexer::f_next(&this_01->v_lexer);
          f_expression((t_parser *)(local_180 + 0x10));
          std::
          make_unique<xemmai::ast::t_object_put,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,xemmai::t_object*&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                    ((t_at *)local_168,
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     &key,(t_object **)&__range4,
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     &local_150);
          std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
          unique_ptr<xemmai::ast::t_object_put,std::default_delete<xemmai::ast::t_object_put>,void>
                    ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)
                     this,(unique_ptr<xemmai::ast::t_object_put,_std::default_delete<xemmai::ast::t_object_put>_>
                           *)local_168);
          std::
          unique_ptr<xemmai::ast::t_object_put,_std::default_delete<xemmai::ast::t_object_put>_>::
          ~unique_ptr((unique_ptr<xemmai::ast::t_object_put,_std::default_delete<xemmai::ast::t_object_put>_>
                       *)local_168);
          std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
          ~unique_ptr((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                      (local_180 + 0x10));
        }
        else {
          std::
          make_unique<xemmai::ast::t_object_get,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,xemmai::t_object*&>
                    ((t_at *)local_180,
                     (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                     &key,(t_object **)&__range4);
          std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
          unique_ptr<xemmai::ast::t_object_get,std::default_delete<xemmai::ast::t_object_get>,void>
                    ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)
                     this,(unique_ptr<xemmai::ast::t_object_get,_std::default_delete<xemmai::ast::t_object_get>_>
                           *)local_180);
          std::
          unique_ptr<xemmai::ast::t_object_get,_std::default_delete<xemmai::ast::t_object_get>_>::
          ~unique_ptr((unique_ptr<xemmai::ast::t_object_get,_std::default_delete<xemmai::ast::t_object_get>_>
                       *)local_180);
        }
      }
      local_180._12_4_ = 1;
      std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
                ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 &__range4);
    }
    break;
  case c_token__ATMARK:
    this_02 = &this_01->v_lexer;
    lambda._M_t.
    super___uniq_ptr_impl<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>._M_t.
    super__Tuple_impl<0UL,_xemmai::ast::t_lambda_*,_std::default_delete<xemmai::ast::t_lambda>_>.
    super__Head_base<0UL,_xemmai::ast::t_lambda_*,_false>._M_head_impl =
         (__uniq_ptr_data<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>,_true,_true>
          )t_lexer::f_indent(this_02);
    t_lexer::f_next(this_02);
    std::make_unique<xemmai::ast::t_lambda,xemmai::t_at&,xemmai::ast::t_scope*&>
              ((t_at *)&stack0xfffffffffffffe08,(t_scope **)&outer);
    bVar4 = t_lexer::f_newline(this_02);
    if ((!bVar4) &&
       (tVar5 = t_lexer::f_token(&this_01->v_lexer), tVar5 == c_token__LEFT_PARENTHESIS)) {
      t_lexer::f_next(&this_01->v_lexer);
      tVar5 = t_lexer::f_token(&this_01->v_lexer);
      if (tVar5 != c_token__RIGHT_PARENTHESIS) {
        while (tVar5 = t_lexer::f_token(&this_01->v_lexer), tVar5 != c_token__ASTERISK) {
          if (tVar5 != c_token__SYMBOL) {
            local_2b8 = sv(L"expecting symbol or \'*\'.",0x18);
            f_throw(this_01,local_2b8);
          }
          ptVar8 = std::
                   unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
                   operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
          ptVar9 = std::
                   unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
                   operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
          local_240._40_8_ = f_symbol(this_01);
          local_240._24_8_ = 0;
          local_240._32_8_ = 0;
          t_code::t_variable::t_variable((t_variable *)(local_240 + 0x18));
          pVar24 = std::
                   map<xemmai::t_object*,xemmai::t_code::t_variable,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                   ::emplace<xemmai::t_object*,xemmai::t_code::t_variable>
                             ((map<xemmai::t_object*,xemmai::t_code::t_variable,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                               *)&(ptVar9->super_t_scope).v_variables,
                              (t_object **)(local_240 + 0x28),(t_variable *)(local_240 + 0x18));
          local_240._8_8_ = pVar24.first._M_node;
          local_240[0x10] = pVar24.second;
          local_240._48_8_ = local_240._8_8_;
          local_240[0x38] = local_240[0x10];
          ppVar10 = std::
                    _Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>
                    ::operator->((_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>
                                  *)(local_240 + 0x30));
          local_240._64_8_ = &ppVar10->second;
          std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
          push_back(&(ptVar8->super_t_scope).v_privates,(value_type *)(local_240 + 0x40));
          t_lexer::f_next(&this_01->v_lexer);
          tVar5 = t_lexer::f_token(&this_01->v_lexer);
          if (tVar5 == c_token__EQUAL) {
            t_lexer::f_next(&this_01->v_lexer);
            ptVar8 = std::
                     unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                     ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                                   *)&stack0xfffffffffffffe08);
            f_expression((t_parser *)local_240);
            std::
            vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ::push_back(&ptVar8->v_defaults,(value_type *)local_240);
            std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
            ~unique_ptr((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
                         *)local_240);
          }
          else {
            ptVar8 = std::
                     unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                     ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                                   *)&stack0xfffffffffffffe08);
            sVar16 = std::
                     vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                     ::size(&ptVar8->v_defaults);
            if (sVar16 != 0) {
              local_250 = sv(L"expecting \'=\'.",0xe);
              f_throw(this_01,local_250);
            }
          }
          bVar4 = t_lexer::f_newline(&this_01->v_lexer);
          if ((!bVar4) ||
             (tVar5 = t_lexer::f_token(&this_01->v_lexer), tVar5 == c_token__RIGHT_PARENTHESIS)) {
            tVar5 = t_lexer::f_token(&this_01->v_lexer);
            if (tVar5 != c_token__COMMA) goto LAB_0025905a;
            t_lexer::f_next(&this_01->v_lexer);
          }
        }
        t_lexer::f_next(&this_01->v_lexer);
        tVar5 = t_lexer::f_token(&this_01->v_lexer);
        if (tVar5 != c_token__SYMBOL) {
          local_260 = sv(L"expecting symbol.",0x11);
          f_throw(this_01,local_260);
        }
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        ptVar9 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        local_280 = f_symbol(this_01);
        local_298.v_shared = false;
        local_298.v_varies = false;
        local_298._2_6_ = 0;
        local_298.v_index = 0;
        t_code::t_variable::t_variable(&local_298);
        pVar24 = std::
                 map<xemmai::t_object*,xemmai::t_code::t_variable,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                 ::emplace<xemmai::t_object*,xemmai::t_code::t_variable>
                           ((map<xemmai::t_object*,xemmai::t_code::t_variable,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                             *)&(ptVar9->super_t_scope).v_variables,&local_280,&local_298);
        local_2a8 = (_Base_ptr)pVar24.first._M_node;
        local_2a0 = pVar24.second;
        local_278._M_node = local_2a8;
        local_270 = (bool)local_2a0;
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>
                  ::operator->(&local_278);
        local_268 = (t_object *)&ppVar10->second;
        std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
        push_back(&(ptVar8->super_t_scope).v_privates,(value_type *)&local_268);
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        ptVar8->v_variadic = true;
        t_lexer::f_next(&this_01->v_lexer);
LAB_0025905a:
        tVar5 = t_lexer::f_token(&this_01->v_lexer);
        if (tVar5 != c_token__RIGHT_PARENTHESIS) {
          join_0x00000010_0x00000000_ = sv(L"expecting \')\'.",0xe);
          f_throw(this_01,join_0x00000010_0x00000000_);
        }
      }
      t_lexer::f_next(&this_01->v_lexer);
    }
    ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
             operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                         *)&stack0xfffffffffffffe08);
    sVar11 = std::
             map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
             ::size(&(ptVar8->super_t_scope).v_variables);
    ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
             operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                         *)&stack0xfffffffffffffe08);
    ptVar8->v_arguments = sVar11;
    this_01->v_scope->v_shared = true;
    ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
             get((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_> *)
                 &stack0xfffffffffffffe08);
    local_708 = (t_scope *)0x0;
    if (ptVar8 != (pointer)0x0) {
      local_708 = &ptVar8->super_t_scope;
    }
    this_01->v_scope = local_708;
    local_2d8[0xf] = this_01->v_can_jump & 1;
    local_2d8[0xe] = this_01->v_can_return & 1;
    this_01->v_can_return = true;
    bVar4 = t_lexer::f_newline(&this_01->v_lexer);
    if (bVar4) {
      _Var12.
      super___uniq_ptr_impl<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>._M_t
      .super__Tuple_impl<0UL,_xemmai::ast::t_lambda_*,_std::default_delete<xemmai::ast::t_lambda>_>.
      super__Head_base<0UL,_xemmai::ast::t_lambda_*,_false>._M_head_impl =
           (__uniq_ptr_impl<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>)
           t_lexer::f_indent(&this_01->v_lexer);
      if ((ulong)lambda._M_t.
                 super___uniq_ptr_impl<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_xemmai::ast::t_lambda_*,_std::default_delete<xemmai::ast::t_lambda>_>
                 .super__Head_base<0UL,_xemmai::ast::t_lambda_*,_false>._M_head_impl <
          (ulong)_Var12.
                 super___uniq_ptr_impl<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_xemmai::ast::t_lambda_*,_std::default_delete<xemmai::ast::t_lambda>_>
                 .super__Head_base<0UL,_xemmai::ast::t_lambda_*,_false>._M_head_impl) {
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        f_block(this_01,&(ptVar8->super_t_scope).v_block);
      }
    }
    else {
      ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
               operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                           *)&stack0xfffffffffffffe08);
      f_expression((t_parser *)local_2d8);
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
      ::push_back(&(ptVar8->super_t_scope).v_block,(value_type *)local_2d8);
      std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
                ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 local_2d8);
      bVar4 = t_lexer::f_newline(&this_01->v_lexer);
      if ((bVar4) &&
         (_Var12.
          super___uniq_ptr_impl<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>.
          _M_t.
          super__Tuple_impl<0UL,_xemmai::ast::t_lambda_*,_std::default_delete<xemmai::ast::t_lambda>_>
          .super__Head_base<0UL,_xemmai::ast::t_lambda_*,_false>._M_head_impl =
               (__uniq_ptr_impl<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>)
               t_lexer::f_indent(&this_01->v_lexer),
         (ulong)lambda._M_t.
                super___uniq_ptr_impl<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                ._M_t.
                super__Tuple_impl<0UL,_xemmai::ast::t_lambda_*,_std::default_delete<xemmai::ast::t_lambda>_>
                .super__Head_base<0UL,_xemmai::ast::t_lambda_*,_false>._M_head_impl <
         (ulong)_Var12.
                super___uniq_ptr_impl<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                ._M_t.
                super__Tuple_impl<0UL,_xemmai::ast::t_lambda_*,_std::default_delete<xemmai::ast::t_lambda>_>
                .super__Head_base<0UL,_xemmai::ast::t_lambda_*,_false>._M_head_impl)) {
        bVar25 = sv(L"unexpected indent.",0x12);
        f_throw(this_01,bVar25);
      }
    }
    ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
             operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                         *)&stack0xfffffffffffffe08);
    psVar13 = &(ptVar8->super_t_scope).v_unresolveds;
    __end3 = std::
             set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
             ::begin(psVar13);
    symbol_2 = (t_object *)
               std::
               set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
               ::end(psVar13);
    while (bVar4 = std::operator==(&__end3,(_Self *)&symbol_2), ((bVar4 ^ 0xffU) & 1) != 0) {
      pptVar14 = std::_Rb_tree_const_iterator<xemmai::t_object_*>::operator*(&__end3);
      i_2._M_node = (_Base_ptr)*pptVar14;
      ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
               operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                           *)&stack0xfffffffffffffe08);
      local_310._M_node =
           (_Base_ptr)
           std::
           map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
           ::find(&(ptVar8->super_t_scope).v_variables,(key_type *)&i_2);
      ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
               operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                           *)&stack0xfffffffffffffe08);
      local_318._M_node =
           (_Base_ptr)
           std::
           map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
           ::end(&(ptVar8->super_t_scope).v_variables);
      bVar4 = std::operator==(&local_310,&local_318);
      if (bVar4) {
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        std::
        set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
        ::insert(&((ptVar8->super_t_scope).v_outer)->v_unresolveds,(value_type *)&i_2);
      }
      else {
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>
                  ::operator->(&local_310);
        (ppVar10->second).v_shared = true;
      }
      std::_Rb_tree_const_iterator<xemmai::t_object_*>::operator++(&__end3);
    }
    ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
             operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                         *)&stack0xfffffffffffffe08);
    psVar13 = &(ptVar8->super_t_scope).v_references;
    __end3_1 = std::
               set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
               ::begin(psVar13);
    symbol_3 = (t_object *)
               std::
               set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
               ::end(psVar13);
    while (bVar4 = std::operator==(&__end3_1,(_Self *)&symbol_3), ((bVar4 ^ 0xffU) & 1) != 0) {
      pptVar14 = std::_Rb_tree_const_iterator<xemmai::t_object_*>::operator*(&__end3_1);
      i_3._M_node = (_Base_ptr)*pptVar14;
      ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
               operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                           *)&stack0xfffffffffffffe08);
      local_350._M_node =
           (_Base_ptr)
           std::
           map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
           ::find(&(ptVar8->super_t_scope).v_variables,(key_type *)&i_3);
      ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
               operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                           *)&stack0xfffffffffffffe08);
      local_358._M_node =
           (_Base_ptr)
           std::
           map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
           ::end(&(ptVar8->super_t_scope).v_variables);
      bVar4 = std::operator==(&local_350,&local_358);
      if (bVar4) {
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        std::
        set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
        ::insert(&((ptVar8->super_t_scope).v_outer)->v_unresolveds,(value_type *)&i_3);
      }
      std::_Rb_tree_const_iterator<xemmai::t_object_*>::operator++(&__end3_1);
    }
    ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
             operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                         *)&stack0xfffffffffffffe08);
    this_01->v_scope = (ptVar8->super_t_scope).v_outer;
    this_01->v_can_jump = (bool)(local_2d8[0xf] & 1);
    this_01->v_can_return = (bool)(local_2d8[0xe] & 1);
    std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::vector
              ((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                *)&i_1);
    ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
             operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                         *)&stack0xfffffffffffffe08);
    std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::swap
              ((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                *)&i_1,&(ptVar8->super_t_scope).v_privates);
    ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
             operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                         *)&stack0xfffffffffffffe08);
    if (((ptVar8->super_t_scope).v_self_shared & 1U) != 0) {
      ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
               operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                           *)&stack0xfffffffffffffe08);
      (ptVar8->super_t_scope).v_shareds = (ptVar8->super_t_scope).v_shareds + 1;
    }
    j._M_current = (t_variable **)
                   std::
                   vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                   ::begin((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                            *)&i_1);
    ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
             operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                         *)&stack0xfffffffffffffe08);
    p = (t_variable *)
        __gnu_cxx::
        __normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
        ::operator+(&j,ptVar8->v_arguments);
    while (bVar4 = __gnu_cxx::
                   operator==<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
                             (&j,(__normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
                                  *)&p), ((bVar4 ^ 0xffU) & 1) != 0) {
      pptVar15 = __gnu_cxx::
                 __normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
                 ::operator*(&j);
      local_398 = (t_object *)*pptVar15;
      if (((ulong)local_398->v_next & 1) == 0) {
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        local_778 = (t_object *)
                    std::
                    vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                    ::size(&(ptVar8->super_t_scope).v_privates);
      }
      else {
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        local_778 = (t_object *)(ptVar8->super_t_scope).v_shareds;
        (ptVar8->super_t_scope).v_shareds = (size_t)((long)&local_778->v_next + 1);
      }
      local_398->v_previous = local_778;
      ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::
               operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                           *)&stack0xfffffffffffffe08);
      std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
      push_back(&(ptVar8->super_t_scope).v_privates,(value_type *)&local_398);
      __gnu_cxx::
      __normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
      ::operator++(&j);
    }
    while( true ) {
      p_1 = (t_variable *)
            std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
            ::end((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                   *)&i_1);
      bVar4 = __gnu_cxx::
              operator==<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
                        (&j,(__normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
                             *)&p_1);
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      pptVar15 = __gnu_cxx::
                 __normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
                 ::operator*(&j);
      indent_2 = (size_t)*pptVar15;
      if ((((t_variable *)indent_2)->v_shared & 1U) == 0) {
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        sVar16 = std::
                 vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                 ::size(&(ptVar8->super_t_scope).v_privates);
        *(size_type *)(indent_2 + 8) = sVar16;
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
        push_back(&(ptVar8->super_t_scope).v_privates,(value_type *)&indent_2);
      }
      else {
        ptVar8 = std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                 ::operator->((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>
                               *)&stack0xfffffffffffffe08);
        sVar1 = (ptVar8->super_t_scope).v_shareds;
        (ptVar8->super_t_scope).v_shareds = sVar1 + 1;
        *(size_t *)(indent_2 + 8) = sVar1;
      }
      __gnu_cxx::
      __normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
      ::operator++(&j);
    }
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_lambda,std::default_delete<xemmai::ast::t_lambda>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_> *)
               &stack0xfffffffffffffe08);
    local_180._12_4_ = 1;
    std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
    ~vector((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_> *)
            &i_1);
    std::unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_lambda,_std::default_delete<xemmai::ast::t_lambda>_> *)
               &stack0xfffffffffffffe08);
    break;
  case c_token__LEFT_BRACKET:
    call_1._M_t.
    super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>._M_t.
    super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>.
    super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
         (__uniq_ptr_data<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>,_true,_true>
         )t_lexer::f_indent(&this_01->v_lexer);
    t_lexer::f_next(&this_01->v_lexer);
    ptVar2 = this_01->v_module;
    ptVar17 = f_global();
    ptVar18 = t_global::f_type<xemmai::t_list>(ptVar17);
    ptVar19 = t_object::f_of(ptVar18);
    t_script::f_slot(ptVar2,ptVar19);
    std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*>
              ((t_at *)local_3c0,(t_object **)&outer);
    std::
    make_unique<xemmai::ast::t_call,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_literal<xemmai::t_object*>,std::default_delete<xemmai::ast::t_literal<xemmai::t_object*>>>>
              ((t_at *)(local_3c0 + 8),
               (unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                *)&outer);
    std::
    unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
    ::~unique_ptr((unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                   *)local_3c0);
    bVar4 = t_lexer::f_newline(&this_01->v_lexer);
    if (((!bVar4) ||
        (_Var21.
         super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>._M_t.
         super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>.
         super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
              (__uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>)
              t_lexer::f_indent(&this_01->v_lexer),
        (ulong)call_1._M_t.
               super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
               .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl <
        (ulong)_Var21.
               super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
               .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl)) &&
       (tVar5 = t_lexer::f_token(&this_01->v_lexer), _Var3 = call_1, tVar5 != c_token__RIGHT_BRACKET
       )) {
      ptVar20 = std::unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>::
                operator->((unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                            *)(local_3c0 + 8));
      bVar4 = f_expressions(this_01,(size_t)_Var3._M_t.
                                            super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                                            .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>.
                                            _M_head_impl,&ptVar20->v_arguments);
      ptVar20 = std::unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>::
                operator->((unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                            *)(local_3c0 + 8));
      ptVar20->v_expand = bVar4;
    }
    bVar4 = t_lexer::f_newline(&this_01->v_lexer);
    if (((!bVar4) ||
        (_Var21.
         super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>._M_t.
         super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>.
         super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
              (__uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>)
              t_lexer::f_indent(&this_01->v_lexer),
        (ulong)call_1._M_t.
               super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
               .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl <=
        (ulong)_Var21.
               super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
               .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl)) &&
       (tVar5 = t_lexer::f_token(&this_01->v_lexer), tVar5 == c_token__RIGHT_BRACKET)) {
      t_lexer::f_next(&this_01->v_lexer);
    }
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_call,std::default_delete<xemmai::ast::t_call>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_> *)
               (local_3c0 + 8));
    local_180._12_4_ = 1;
    std::unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_> *)
               (local_3c0 + 8));
    break;
  case c_token__LEFT_BRACE:
    call_2._M_t.
    super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>._M_t.
    super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>.
    super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
         (__uniq_ptr_data<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>,_true,_true>
         )t_lexer::f_indent(&this_01->v_lexer);
    t_lexer::f_next(&this_01->v_lexer);
    ptVar2 = this_01->v_module;
    ptVar17 = f_global();
    ptVar18 = t_global::f_type<xemmai::t_map>(ptVar17);
    ptVar19 = t_object::f_of(ptVar18);
    local_3f0._8_8_ = t_script::f_slot(ptVar2,ptVar19);
    std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*>
              ((t_at *)(local_3f0 + 0x10),(t_object **)&outer);
    std::
    make_unique<xemmai::ast::t_call,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_literal<xemmai::t_object*>,std::default_delete<xemmai::ast::t_literal<xemmai::t_object*>>>>
              ((t_at *)&stack0xfffffffffffffc28,
               (unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                *)&outer);
    std::
    unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
    ::~unique_ptr((unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                   *)(local_3f0 + 0x10));
    bVar4 = t_lexer::f_newline(&this_01->v_lexer);
    if (((!bVar4) ||
        (_Var21.
         super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>._M_t.
         super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>.
         super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
              (__uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>)
              t_lexer::f_indent(&this_01->v_lexer),
        (ulong)call_2._M_t.
               super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
               .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl <
        (ulong)_Var21.
               super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
               .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl)) &&
       (tVar5 = t_lexer::f_token(&this_01->v_lexer), tVar5 != c_token__RIGHT_BRACE)) {
      do {
        while( true ) {
          ptVar20 = std::unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                    ::operator->((unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                                  *)&stack0xfffffffffffffc28);
          f_expression((t_parser *)local_3f0);
          std::
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          ::push_back(&ptVar20->v_arguments,(value_type *)local_3f0);
          std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
          ~unique_ptr((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                      local_3f0);
          bVar4 = f_single_colon(this_01);
          if (!bVar4) {
            local_400 = sv(L"expecting \':\'.",0xe);
            f_throw(this_01,local_400);
          }
          t_lexer::f_next(&this_01->v_lexer);
          ptVar20 = std::unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                    ::operator->((unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                                  *)&stack0xfffffffffffffc28);
          f_expression((t_parser *)(local_410 + 8));
          std::
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          ::push_back(&ptVar20->v_arguments,(value_type *)(local_410 + 8));
          std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
          ~unique_ptr((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                      (local_410 + 8));
          tVar5 = t_lexer::f_token(&this_01->v_lexer);
          if (tVar5 != c_token__COMMA) break;
          bVar4 = t_lexer::f_newline(&this_01->v_lexer);
          if ((bVar4) &&
             (_Var21.
              super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>.
              _M_t.
              super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
              .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>)
                   t_lexer::f_indent(&this_01->v_lexer),
             (ulong)_Var21.
                    super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                    .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl <
             (ulong)call_2._M_t.
                    super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                    .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl))
          goto LAB_00259ecc;
          t_lexer::f_next(&this_01->v_lexer);
        }
        bVar4 = t_lexer::f_newline(&this_01->v_lexer);
      } while ((bVar4) &&
              (_Var21.
               super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
               .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
                    (__uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                    )t_lexer::f_indent(&this_01->v_lexer),
              (ulong)call_2._M_t.
                     super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                     .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl <
              (ulong)_Var21.
                     super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
                     .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl));
    }
LAB_00259ecc:
    bVar4 = t_lexer::f_newline(&this_01->v_lexer);
    if (((!bVar4) ||
        (_Var21.
         super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>._M_t.
         super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>.
         super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl =
              (__uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>)
              t_lexer::f_indent(&this_01->v_lexer),
        (ulong)call_2._M_t.
               super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
               .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl <=
        (ulong)_Var21.
               super___uniq_ptr_impl<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_call_*,_std::default_delete<xemmai::ast::t_call>_>
               .super__Head_base<0UL,_xemmai::ast::t_call_*,_false>._M_head_impl)) &&
       (tVar5 = t_lexer::f_token(&this_01->v_lexer), tVar5 == c_token__RIGHT_BRACE)) {
      t_lexer::f_next(&this_01->v_lexer);
    }
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_call,std::default_delete<xemmai::ast::t_call>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_> *)
               &stack0xfffffffffffffc28);
    local_180._12_4_ = 1;
    std::unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_call,_std::default_delete<xemmai::ast::t_call>_> *)
               &stack0xfffffffffffffc28);
    break;
  case c_token__NULL:
    t_lexer::f_next(&this_01->v_lexer);
    std::make_unique<xemmai::ast::t_null,xemmai::t_at&>((t_at *)local_410);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_null,std::default_delete<xemmai::ast::t_null>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_null,_std::default_delete<xemmai::ast::t_null>_> *)
               local_410);
    std::unique_ptr<xemmai::ast::t_null,_std::default_delete<xemmai::ast::t_null>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_null,_std::default_delete<xemmai::ast::t_null>_> *)
               local_410);
    break;
  case c_token__TRUE:
    t_lexer::f_next(&this_01->v_lexer);
    local_428[0xf] = 1;
    std::make_unique<xemmai::ast::t_literal<bool>,xemmai::t_at&,bool>
              ((t_at *)(local_428 + 0x10),(bool *)&outer);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_literal<bool>,std::default_delete<xemmai::ast::t_literal<bool>>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_literal<bool>,_std::default_delete<xemmai::ast::t_literal<bool>_>_>
                *)(local_428 + 0x10));
    std::
    unique_ptr<xemmai::ast::t_literal<bool>,_std::default_delete<xemmai::ast::t_literal<bool>_>_>::
    ~unique_ptr((unique_ptr<xemmai::ast::t_literal<bool>,_std::default_delete<xemmai::ast::t_literal<bool>_>_>
                 *)(local_428 + 0x10));
    break;
  case c_token__FALSE:
    t_lexer::f_next(&this_01->v_lexer);
    value._7_1_ = 0;
    std::make_unique<xemmai::ast::t_literal<bool>,xemmai::t_at&,bool>
              ((t_at *)local_428,(bool *)&outer);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_literal<bool>,std::default_delete<xemmai::ast::t_literal<bool>>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_literal<bool>,_std::default_delete<xemmai::ast::t_literal<bool>_>_>
                *)local_428);
    std::
    unique_ptr<xemmai::ast::t_literal<bool>,_std::default_delete<xemmai::ast::t_literal<bool>_>_>::
    ~unique_ptr((unique_ptr<xemmai::ast::t_literal<bool>,_std::default_delete<xemmai::ast::t_literal<bool>_>_>
                 *)local_428);
    break;
  case c_token__INTEGER:
    local_438 = t_lexer::f_integer(&this_01->v_lexer);
    t_lexer::f_next(&this_01->v_lexer);
    std::make_unique<xemmai::ast::t_literal<long>,xemmai::t_at&,long&>
              ((t_at *)&value_1,(long *)&outer);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_literal<long>,std::default_delete<xemmai::ast::t_literal<long>>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_literal<long>,_std::default_delete<xemmai::ast::t_literal<long>_>_>
                *)&value_1);
    std::
    unique_ptr<xemmai::ast::t_literal<long>,_std::default_delete<xemmai::ast::t_literal<long>_>_>::
    ~unique_ptr((unique_ptr<xemmai::ast::t_literal<long>,_std::default_delete<xemmai::ast::t_literal<long>_>_>
                 *)&value_1);
    break;
  case c_token__FLOAT:
    local_448 = t_lexer::f_float(&this_01->v_lexer);
    t_lexer::f_next(&this_01->v_lexer);
    std::make_unique<xemmai::ast::t_literal<double>,xemmai::t_at&,double&>
              ((t_at *)&value_2,(double *)&outer);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_literal<double>,std::default_delete<xemmai::ast::t_literal<double>>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_literal<double>,_std::default_delete<xemmai::ast::t_literal<double>_>_>
                *)&value_2);
    std::
    unique_ptr<xemmai::ast::t_literal<double>,_std::default_delete<xemmai::ast::t_literal<double>_>_>
    ::~unique_ptr((unique_ptr<xemmai::ast::t_literal<double>,_std::default_delete<xemmai::ast::t_literal<double>_>_>
                   *)&value_2);
    break;
  case c_token__STRING:
    local_460._8_8_ = t_lexer::f_string(&this_01->v_lexer);
    t_lexer::f_next(&this_01->v_lexer);
    at_2.v_column = (size_t)t_script::f_slot(this_01->v_module,(t_object *)local_460._8_8_);
    std::make_unique<xemmai::ast::t_literal<xemmai::t_object*>,xemmai::t_at&,xemmai::t_object*>
              ((t_at *)local_460,(t_object **)&outer);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_literal<xemmai::t_object*>,std::default_delete<xemmai::ast::t_literal<xemmai::t_object*>>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                *)local_460);
    std::
    unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
    ::~unique_ptr((unique_ptr<xemmai::ast::t_literal<xemmai::t_object_*>,_std::default_delete<xemmai::ast::t_literal<xemmai::t_object_*>_>_>
                   *)local_460);
    break;
  case c_token__BREAK:
    ptVar6 = t_lexer::f_at(&this_01->v_lexer);
    local_480 = (undefined1  [8])ptVar6->v_position;
    at_2.v_position = ptVar6->v_line;
    at_2.v_line = ptVar6->v_column;
    if ((this_01->v_can_jump & 1U) == 0) {
      local_498._8_16_ = (undefined1  [16])sv(L"expecting inside loop.",0x16);
      f_throw(this_01,(wstring_view)local_498._8_16_,(t_at *)local_480);
    }
    t_lexer::f_next(&this_01->v_lexer);
    bVar4 = f_end_of_expression(this_01);
    if (bVar4) {
      std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
      unique_ptr<std::default_delete<xemmai::ast::t_node>,void>
                ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)
                 &at_3.v_column,(nullptr_t)0x0);
    }
    else {
      f_expression((t_parser *)&at_3.v_column);
    }
    std::
    make_unique<xemmai::ast::t_break,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((t_at *)local_498,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_480);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_break,std::default_delete<xemmai::ast::t_break>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_break,_std::default_delete<xemmai::ast::t_break>_> *)
               local_498);
    std::unique_ptr<xemmai::ast::t_break,_std::default_delete<xemmai::ast::t_break>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_break,_std::default_delete<xemmai::ast::t_break>_> *)
               local_498);
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               &at_3.v_column);
    break;
  case c_token__CONTINUE:
    ptVar6 = t_lexer::f_at(&this_01->v_lexer);
    local_4b8 = (undefined1  [8])ptVar6->v_position;
    at_3.v_position = ptVar6->v_line;
    at_3.v_line = ptVar6->v_column;
    if ((this_01->v_can_jump & 1U) == 0) {
      local_4d0._8_16_ = (undefined1  [16])sv(L"expecting inside loop.",0x16);
      f_throw(this_01,(wstring_view)local_4d0._8_16_,(t_at *)local_4b8);
    }
    t_lexer::f_next(&this_01->v_lexer);
    std::make_unique<xemmai::ast::t_continue,xemmai::t_at&>((t_at *)local_4d0);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_continue,std::default_delete<xemmai::ast::t_continue>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_continue,_std::default_delete<xemmai::ast::t_continue>_> *
               )local_4d0);
    std::unique_ptr<xemmai::ast::t_continue,_std::default_delete<xemmai::ast::t_continue>_>::
    ~unique_ptr((unique_ptr<xemmai::ast::t_continue,_std::default_delete<xemmai::ast::t_continue>_>
                 *)local_4d0);
    break;
  case c_token__RETURN:
    if ((this_01->v_can_return & 1U) == 0) {
      join_0x00000010_0x00000000_ = sv(L"expecting within lambda.",0x18);
      f_throw(this_01,join_0x00000010_0x00000000_);
    }
    ptVar6 = t_lexer::f_at(&this_01->v_lexer);
    local_4f8._M_t.
    super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
    super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl =
         (tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)ptVar6->v_position
    ;
    at_4.v_position = ptVar6->v_line;
    at_4.v_line = ptVar6->v_column;
    t_lexer::f_next(&this_01->v_lexer);
    bVar4 = f_end_of_expression(this_01);
    if (bVar4) {
      std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
      unique_ptr<std::default_delete<xemmai::ast::t_node>,void>
                ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)
                 local_508,(nullptr_t)0x0);
    }
    else {
      f_expression((t_parser *)local_508);
    }
    std::
    make_unique<xemmai::ast::t_return,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((t_at *)(local_508 + 8),
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               &local_4f8);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_return,std::default_delete<xemmai::ast::t_return>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_return,_std::default_delete<xemmai::ast::t_return>_> *)
               (local_508 + 8));
    std::unique_ptr<xemmai::ast::t_return,_std::default_delete<xemmai::ast::t_return>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_return,_std::default_delete<xemmai::ast::t_return>_> *)
               (local_508 + 8));
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_508);
    break;
  case c_token__THROW:
    ptVar6 = t_lexer::f_at(&this_01->v_lexer);
    at_5.v_line = ptVar6->v_column;
    _Stack_528._M_t.
    super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
    super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl =
         (tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)ptVar6->v_position
    ;
    at_5.v_position = ptVar6->v_line;
    t_lexer::f_next(&this_01->v_lexer);
    f_expression((t_parser *)local_538);
    std::
    make_unique<xemmai::ast::t_throw,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((t_at *)(local_538 + 8),
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               &_Stack_528);
    std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
    unique_ptr<xemmai::ast::t_throw,std::default_delete<xemmai::ast::t_throw>,void>
              ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)this,
               (unique_ptr<xemmai::ast::t_throw,_std::default_delete<xemmai::ast::t_throw>_> *)
               (local_538 + 8));
    std::unique_ptr<xemmai::ast::t_throw,_std::default_delete<xemmai::ast::t_throw>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_throw,_std::default_delete<xemmai::ast::t_throw>_> *)
               (local_538 + 8));
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_538);
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_target(bool a_assignable)
{
	t_at at = v_lexer.f_at();
	switch (v_lexer.f_token()) {
	case t_lexer::c_token__COLON:
	case t_lexer::c_token__SYMBOL:
	case t_lexer::c_token__SELF:
		{
			size_t outer = 0;
			auto scope = v_scope;
			if (v_lexer.f_token() == t_lexer::c_token__COLON) {
				outer = v_lexer.f_integer();
				for (size_t i = 0; i < outer; ++i) {
					if (!scope) f_throw(L"no more outer scope."sv);
					scope = scope->v_outer;
				}
				v_lexer.f_next();
			}
			switch (v_lexer.f_token()) {
			case t_lexer::c_token__SYMBOL:
				{
					auto symbol = f_symbol();
					v_lexer.f_next();
					if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
						if (!a_assignable) f_throw(L"can not assign to expression."sv);
						if (!scope) f_throw(L"no more outer scope."sv);
						v_lexer.f_next();
						auto& variable = f_variable(scope, symbol);
						if (outer > 0) variable.v_shared = variable.v_varies = true;
						return std::make_unique<ast::t_scope_put>(at, outer, variable, f_expression());
					}
					if (scope) (outer > 0 ? scope->v_unresolveds : scope->v_references).insert(symbol);
					return std::make_unique<ast::t_symbol_get>(at, outer, scope, symbol);
				}
			case t_lexer::c_token__SELF:
				{
					if (!scope) f_throw(L"no more outer scope."sv);
					if (outer > 0) scope->v_self_shared = true;
					std::unique_ptr<ast::t_node> target(new ast::t_self(at, outer));
					for (auto c : v_lexer.f_value()) target.reset(c == L'@' ? new ast::t_class(at, std::move(target)) : static_cast<ast::t_node*>(new ast::t_super(at, std::move(target))));
					v_lexer.f_next();
					if (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__SYMBOL) {
						t_at at = v_lexer.f_at();
						auto key = f_symbol();
						v_lexer.f_next();
						if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
							if (!a_assignable) f_throw(L"can not assign to expression."sv);
							v_lexer.f_next();
							return std::make_unique<ast::t_object_put>(at, std::move(target), key, f_expression());
						}
						return std::make_unique<ast::t_object_get>(at, std::move(target), key);
					}
					return target;
				}
			default:
				f_throw(L"expecting symbol or self."sv);
			}
		}
	case t_lexer::c_token__APOSTROPHE:
		v_lexer.f_next();
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__SYMBOL:
			{
				auto symbol = f_symbol();
				v_lexer.f_next();
				return std::make_unique<ast::t_literal<t_object*>>(at, symbol);
			}
		case t_lexer::c_token__LEFT_PARENTHESIS:
			{
				size_t indent = v_lexer.f_indent();
				v_lexer.f_next();
				auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_tuple>()))));
				if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) call->v_expand = f_expressions(indent, call->v_arguments);
				if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_PARENTHESIS) v_lexer.f_next();
				return call;
			}
		default:
			f_throw(L"expecting symbol or '('."sv);
		}
	case t_lexer::c_token__LEFT_PARENTHESIS:
		{
			v_lexer.f_next();
			auto expression = f_expression();
			if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) f_throw(L"expecting ')'."sv);
			v_lexer.f_next();
			return expression;
		}
	case t_lexer::c_token__ATMARK:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto lambda = std::make_unique<ast::t_lambda>(at, v_scope);
			if (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__LEFT_PARENTHESIS) {
				v_lexer.f_next();
				if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) {
					while (true) {
						switch (v_lexer.f_token()) {
						case t_lexer::c_token__SYMBOL:
							lambda->v_privates.push_back(&lambda->v_variables.emplace(f_symbol(), t_code::t_variable()).first->second);
							v_lexer.f_next();
							if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
								v_lexer.f_next();
								lambda->v_defaults.push_back(f_expression());
							} else {
								if (lambda->v_defaults.size() > 0) f_throw(L"expecting '='."sv);
							}
							if (v_lexer.f_newline() && v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) continue;
							if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
								v_lexer.f_next();
								continue;
							}
							break;
						case t_lexer::c_token__ASTERISK:
							v_lexer.f_next();
							if (v_lexer.f_token() != t_lexer::c_token__SYMBOL) f_throw(L"expecting symbol."sv);
							lambda->v_privates.push_back(&lambda->v_variables.emplace(f_symbol(), t_code::t_variable()).first->second);
							lambda->v_variadic = true;
							v_lexer.f_next();
							break;
						default:
							f_throw(L"expecting symbol or '*'."sv);
						}
						break;
					}
					if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) f_throw(L"expecting ')'."sv);
				}
				v_lexer.f_next();
			}
			lambda->v_arguments = lambda->v_variables.size();
			v_scope->v_shared = true;
			v_scope = lambda.get();
			bool can_jump = v_can_jump;
			bool can_return = v_can_return;
			v_can_return = true;
			if (v_lexer.f_newline()) {
				if (v_lexer.f_indent() > indent) f_block(lambda->v_block);
			} else {
				lambda->v_block.push_back(f_expression());
				if (v_lexer.f_newline() && v_lexer.f_indent() > indent) f_throw(L"unexpected indent."sv);
			}
			for (auto symbol : lambda->v_unresolveds) {
				auto i = lambda->v_variables.find(symbol);
				if (i == lambda->v_variables.end())
					lambda->v_outer->v_unresolveds.insert(symbol);
				else
					i->second.v_shared = true;
			}
			for (auto symbol : lambda->v_references) {
				auto i = lambda->v_variables.find(symbol);
				if (i == lambda->v_variables.end()) lambda->v_outer->v_unresolveds.insert(symbol);
			}
			v_scope = lambda->v_outer;
			v_can_jump = can_jump;
			v_can_return = can_return;
			std::vector<t_code::t_variable*> variables;
			variables.swap(lambda->v_privates);
			if (lambda->v_self_shared) ++lambda->v_shareds;
			auto i = variables.begin();
			for (auto j = i + lambda->v_arguments; i != j; ++i) {
				t_code::t_variable* p = *i;
				p->v_index = p->v_shared ? lambda->v_shareds++ : lambda->v_privates.size();
				lambda->v_privates.push_back(p);
			}
			for (; i != variables.end(); ++i) {
				t_code::t_variable* p = *i;
				if (p->v_shared) {
					p->v_index = lambda->v_shareds++;
				} else {
					p->v_index = lambda->v_privates.size();
					lambda->v_privates.push_back(p);
				}
			}
			return lambda;
		}
	case t_lexer::c_token__LEFT_BRACKET:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_list>()))));
			if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_BRACKET) call->v_expand = f_expressions(indent, call->v_arguments);
			if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_BRACKET) v_lexer.f_next();
			return call;
		}
	case t_lexer::c_token__LEFT_BRACE:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_map>()))));
			if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_BRACE)
				while (true) {
					call->v_arguments.push_back(f_expression());
					if (!f_single_colon()) f_throw(L"expecting ':'."sv);
					v_lexer.f_next();
					call->v_arguments.push_back(f_expression());
					if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
						if (v_lexer.f_newline() && v_lexer.f_indent() < indent) break;
						v_lexer.f_next();
						continue;
					}
					if (!v_lexer.f_newline() || v_lexer.f_indent() <= indent) break;
				}
			if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_BRACE) v_lexer.f_next();
			return call;
		}
	case t_lexer::c_token__NULL:
		v_lexer.f_next();
		return std::make_unique<ast::t_null>(at);
	case t_lexer::c_token__TRUE:
		v_lexer.f_next();
		return std::make_unique<ast::t_literal<bool>>(at, true);
	case t_lexer::c_token__FALSE:
		v_lexer.f_next();
		return std::make_unique<ast::t_literal<bool>>(at, false);
	case t_lexer::c_token__INTEGER:
		{
			auto value = v_lexer.f_integer();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<intptr_t>>(at, value);
		}
	case t_lexer::c_token__FLOAT:
		{
			auto value = v_lexer.f_float();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<double>>(at, value);
		}
	case t_lexer::c_token__STRING:
		{
			auto value = v_lexer.f_string();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(value));
		}
	case t_lexer::c_token__BREAK:
		{
			t_at at = v_lexer.f_at();
			if (!v_can_jump) f_throw(L"expecting inside loop."sv, at);
			v_lexer.f_next();
			return std::make_unique<ast::t_break>(at, f_end_of_expression() ? nullptr : f_expression());
		}
	case t_lexer::c_token__CONTINUE:
		{
			t_at at = v_lexer.f_at();
			if (!v_can_jump) f_throw(L"expecting inside loop."sv, at);
			v_lexer.f_next();
			return std::make_unique<ast::t_continue>(at);
		}
	case t_lexer::c_token__RETURN:
		{
			if (!v_can_return) f_throw(L"expecting within lambda."sv);
			t_at at = v_lexer.f_at();
			v_lexer.f_next();
			return std::make_unique<ast::t_return>(at, f_end_of_expression() ? nullptr : f_expression());
		}
	case t_lexer::c_token__THROW:
		{
			t_at at = v_lexer.f_at();
			v_lexer.f_next();
			return std::make_unique<ast::t_throw>(at, f_expression());
		}
	default:
		f_throw(L"unexpected token."sv);
	}
}